

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_con.h
# Opt level: O0

void __thiscall
mp::
RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
::ConvertWithRhs(RangeConstraintConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::QuadAndLinTerms>
                 *this,ItemType *item,RangeRelations rr)

{
  reference pvVar1;
  AlgConRhs<_1> rr_00;
  QuadAndLinTerms *this_00;
  undefined4 in_EDX;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  double dVar2;
  double dVar3;
  NodeRange NVar4;
  size_type in_stack_fffffffffffff468;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffff470;
  QuadAndLinTerms *in_stack_fffffffffffff478;
  QuadAndLinTerms *in_stack_fffffffffffff480;
  undefined8 in_stack_fffffffffffff488;
  undefined1 fSort;
  QuadAndLinTerms *in_stack_fffffffffffff490;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> *in_stack_fffffffffffff498;
  AlgConRhs<0> in_stack_fffffffffffff4a0;
  AlgConRhs<0> local_b28 [116];
  NodeRange local_788;
  AlgConRhs<_1> local_778 [116];
  NodeRange local_3d8;
  AlgConRhs<1> local_3b8 [116];
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *local_18;
  undefined2 local_3;
  undefined1 local_1;
  
  fSort = (undefined1)((ulong)in_stack_fffffffffffff488 >> 0x38);
  local_3 = (undefined2)in_EDX;
  local_1 = (undefined1)((uint)in_EDX >> 0x10);
  local_18 = in_RSI;
  pvVar1 = std::array<bool,_3UL>::operator[]
                     ((array<bool,_3UL> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  if (((*pvVar1 & 1U) == 0) ||
     (pvVar1 = std::array<bool,_3UL>::operator[]
                         ((array<bool,_3UL> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468),
     (*pvVar1 & 1U) != 0)) {
    pvVar1 = std::array<bool,_3UL>::operator[]
                       ((array<bool,_3UL> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
    if (((*pvVar1 & 1U) == 0) &&
       (pvVar1 = std::array<bool,_3UL>::operator[]
                           ((array<bool,_3UL> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468)
       , (*pvVar1 & 1U) != 0)) {
      rr_00.rhs_ = (double)BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                           ::GetMC(in_RDI);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::GetBody(local_18);
      QuadAndLinTerms::QuadAndLinTerms(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
      dVar2 = AlgConRange::ub(&local_18->super_AlgConRange);
      AlgConRhs<-1>::AlgConRhs(local_778,dVar2);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (in_stack_fffffffffffff498,in_stack_fffffffffffff490,rr_00,(bool)fSort);
      local_788 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                  ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
                            ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                              *)rr_00.rhs_,in_stack_fffffffffffff498);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                (in_stack_fffffffffffff470);
      QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff470);
    }
    else {
      pvVar1 = std::array<bool,_3UL>::operator[]
                         ((array<bool,_3UL> *)in_stack_fffffffffffff470,in_stack_fffffffffffff468);
      if (((*pvVar1 & 1U) != 0) &&
         (pvVar1 = std::array<bool,_3UL>::operator[]
                             ((array<bool,_3UL> *)in_stack_fffffffffffff470,
                              in_stack_fffffffffffff468), (*pvVar1 & 1U) != 0)) {
        this_00 = (QuadAndLinTerms *)
                  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  ::GetMC(in_RDI);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::GetBody(local_18);
        QuadAndLinTerms::QuadAndLinTerms(this_00,in_stack_fffffffffffff478);
        dVar2 = AlgConRange::lb(&local_18->super_AlgConRange);
        dVar3 = AlgConRange::ub(&local_18->super_AlgConRange);
        AlgConRhs<0>::AlgConRhs(local_b28,(dVar2 + dVar3) * 0.5);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
                   in_stack_fffffffffffff498,in_stack_fffffffffffff490,in_stack_fffffffffffff4a0,
                   SUB81((ulong)dVar2 >> 0x38,0));
        NVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                          ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)in_stack_fffffffffffff4a0.rhs_,
                           (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)
                           in_stack_fffffffffffff498);
        AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)NVar4.ir_);
        QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)NVar4.ir_);
      }
    }
  }
  else {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC(in_RDI);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::GetBody(local_18);
    QuadAndLinTerms::QuadAndLinTerms(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
    dVar2 = AlgConRange::lb(&local_18->super_AlgConRange);
    AlgConRhs<1>::AlgConRhs(local_3b8,dVar2);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
               in_stack_fffffffffffff498,in_stack_fffffffffffff490,
               (AlgConRhs<1>)in_stack_fffffffffffff4a0.rhs_,(bool)fSort);
    local_3d8 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
                          ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                            *)in_stack_fffffffffffff4a0.rhs_,
                           (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
                           in_stack_fffffffffffff498);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> *)
               in_stack_fffffffffffff470);
    QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff470);
  }
  return;
}

Assistant:

void ConvertWithRhs(const ItemType& item, RangeRelations rr) {
    if (rr[1] && !rr[2]) {
      GetMC().AddConstraint(
              AlgConGE( item.GetBody(), item.lb() ) );
    } else if (!rr[1] && rr[2]) {
      GetMC().AddConstraint(
              AlgConLE( item.GetBody(), item.ub() ) );
    } else if (rr[1] && rr[2]) {
      assert(item.lb()>=item.ub());
      GetMC().AddConstraint(
            AlgConEQ( item.GetBody(),
                      (item.lb()+item.ub()) / 2.0 ) );
    } // else, both are inf, forget
  }